

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

void Exa3_ManPrint(Exa3_Man_t *p,int i,int iMint,abctime clk)

{
  uint uVar1;
  abctime clk_local;
  int iMint_local;
  int i_local;
  Exa3_Man_t *p_local;
  
  clk_local._0_4_ = iMint;
  clk_local._4_4_ = i;
  _iMint_local = p;
  printf("Iter%6d : ",(ulong)(uint)i);
  Extra_PrintBinary(_stdout,(uint *)&clk_local,_iMint_local->nVars);
  uVar1 = bmcg_sat_solver_varnum(_iMint_local->pSat);
  printf("  Var =%5d  ",(ulong)uVar1);
  uVar1 = bmcg_sat_solver_clausenum(_iMint_local->pSat);
  printf("Cla =%6d  ",(ulong)uVar1);
  uVar1 = bmcg_sat_solver_conflictnum(_iMint_local->pSat);
  printf("Conf =%9d  ",(ulong)uVar1);
  Abc_PrintTime(1,"Time",clk);
  return;
}

Assistant:

void Exa3_ManPrint( Exa3_Man_t * p, int i, int iMint, abctime clk )
{
    printf( "Iter%6d : ", i );
    Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
    printf( "  Var =%5d  ", bmcg_sat_solver_varnum(p->pSat) );
    printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
    printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
    Abc_PrintTime( 1, "Time", clk );
}